

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O3

void deqp::gles3::Functional::invalidTexCubeAttachmentTest(TestContext *testCtx,Context *context)

{
  deUint32 texCube;
  uint local_1c;
  
  (*context->_vptr_Context[9])(context,0x8d40,1);
  logComment((TestContext *)testCtx->m_log,
             "Attaching cube texture using GL_TEXTURE_2D texture target");
  local_1c = 2;
  (*context->_vptr_Context[6])(context,0x8513,2);
  (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,2,0);
  checkError(testCtx,context,0x502);
  logComment((TestContext *)testCtx->m_log,"Attaching deleted cube texture object");
  (*context->_vptr_Context[8])(context,1,&local_1c);
  (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0x8515,(ulong)local_1c,0);
  checkError(testCtx,context,0x502);
  return;
}

Assistant:

static void invalidTexCubeAttachmentTest (tcu::TestContext& testCtx, sglr::Context& context)
{
	context.bindFramebuffer(GL_FRAMEBUFFER, 1);

	logComment(testCtx, "Attaching cube texture using GL_TEXTURE_2D texture target");
	deUint32 texCube = 2;
	context.bindTexture(GL_TEXTURE_CUBE_MAP, texCube);
	context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texCube, 0);
	checkError(testCtx, context, GL_INVALID_OPERATION);

	logComment(testCtx, "Attaching deleted cube texture object");
	context.deleteTextures(1, &texCube);
	context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_CUBE_MAP_POSITIVE_X, texCube, 0);
	checkError(testCtx, context, GL_INVALID_OPERATION);
}